

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linux-perf-events.h
# Opt level: O3

void __thiscall
LinuxEvents<0>::end(LinuxEvents<0> *this,
                   vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *results)

{
  pointer puVar1;
  pointer puVar2;
  int iVar3;
  ssize_t sVar4;
  ulong uVar5;
  uint uVar6;
  ulong uVar7;
  string local_38;
  
  iVar3 = ioctl(this->fd,0x2401,1);
  if (iVar3 == -1) {
    local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_38,"ioctl(PERF_EVENT_IOC_DISABLE)","");
    report_error(this,&local_38);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p);
    }
  }
  puVar1 = (this->temp_result_vec).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
           ._M_impl.super__Vector_impl_data._M_start;
  sVar4 = read(this->fd,puVar1,
               (long)(this->temp_result_vec).
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_finish - (long)puVar1);
  if (sVar4 == -1) {
    local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"read","");
    report_error(this,&local_38);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p);
    }
  }
  puVar1 = (this->temp_result_vec).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar5 = (long)(this->temp_result_vec).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_finish - (long)puVar1 >> 3;
  if (1 < uVar5) {
    puVar2 = (results->super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>).
             _M_impl.super__Vector_impl_data._M_start;
    uVar7 = 1;
    uVar6 = 3;
    do {
      puVar2[uVar6 - 2 >> 1] = puVar1[uVar7];
      uVar7 = (ulong)uVar6;
      uVar6 = uVar6 + 2;
    } while (uVar7 < uVar5);
  }
  return;
}

Assistant:

inline void end(std::vector<unsigned long long> &results) {
    if (ioctl(fd, PERF_EVENT_IOC_DISABLE, PERF_IOC_FLAG_GROUP) == -1) {
      report_error("ioctl(PERF_EVENT_IOC_DISABLE)");
    }

    if (read(fd, &temp_result_vec[0], temp_result_vec.size() * 8) == -1) {
      report_error("read");
    }
    // our actual results are in slots 1,3,5, ... of this structure
    // we really should be checking our ids obtained earlier to be safe
    for (uint32_t i = 1; i < temp_result_vec.size(); i += 2) {
      results[i / 2] = temp_result_vec[i];
    }
  }